

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feefrac.h
# Opt level: O2

weak_ordering FeeRateCompare(FeeFrac *a,FeeFrac *b)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  
  uVar3 = (long)b->size * a->fee;
  lVar5 = SUB168(SEXT816((long)b->size) * SEXT816(a->fee),8);
  uVar4 = (long)a->size * b->fee;
  lVar6 = SUB168(SEXT816((long)a->size) * SEXT816(b->fee),8);
  uVar1 = (ulong)(uVar3 < uVar4);
  bVar2 = -((SBORROW8(lVar5,lVar6) != SBORROW8(lVar5 - lVar6,uVar1)) !=
           (long)((lVar5 - lVar6) - uVar1) < 0) | 1;
  if (uVar3 == uVar4 && lVar5 == lVar6) {
    bVar2 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (weak_ordering)bVar2;
  }
  __stack_chk_fail();
}

Assistant:

inline std::weak_ordering FeeRateCompare(const FeeFrac& a, const FeeFrac& b) noexcept
    {
        auto cross_a = Mul(a.fee, b.size), cross_b = Mul(b.fee, a.size);
        return cross_a <=> cross_b;
    }